

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

void vrna_exp_params_reset(vrna_fold_compound_t *vc,vrna_md_t *md_p)

{
  vrna_exp_param_t *pvVar1;
  
  if ((vc != (vrna_fold_compound_t *)0x0) && (vc->type < 2)) {
    free(vc->exp_params);
    pvVar1 = vrna_exp_params(md_p);
    vc->exp_params = pvVar1;
  }
  return;
}

Assistant:

PUBLIC void
vrna_exp_params_reset(vrna_fold_compound_t  *vc,
                      vrna_md_t             *md_p)
{
  if (vc) {
    switch (vc->type) {
      case VRNA_FC_TYPE_SINGLE:     /* fall through */

      case VRNA_FC_TYPE_COMPARATIVE:
        if (vc->exp_params)
          free(vc->exp_params);

        vc->exp_params = vrna_exp_params(md_p);
        break;

      default:
        break;
    }
  }
}